

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001ccdf0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001ccdf7._0_1_ = '-';
    uRam00000000001ccdf7._1_1_ = '-';
    uRam00000000001ccdf7._2_1_ = '-';
    uRam00000000001ccdf7._3_1_ = '-';
    uRam00000000001ccdf7._4_1_ = '-';
    uRam00000000001ccdf7._5_1_ = '-';
    uRam00000000001ccdf7._6_1_ = '-';
    uRam00000000001ccdf7._7_1_ = '-';
    DAT_001ccde0 = '-';
    DAT_001ccde0_1._0_1_ = '-';
    DAT_001ccde0_1._1_1_ = '-';
    DAT_001ccde0_1._2_1_ = '-';
    DAT_001ccde0_1._3_1_ = '-';
    DAT_001ccde0_1._4_1_ = '-';
    DAT_001ccde0_1._5_1_ = '-';
    DAT_001ccde0_1._6_1_ = '-';
    uRam00000000001ccde8 = 0x2d2d2d2d2d2d2d;
    DAT_001ccdef = 0x2d;
    DAT_001ccdd0 = '-';
    DAT_001ccdd0_1._0_1_ = '-';
    DAT_001ccdd0_1._1_1_ = '-';
    DAT_001ccdd0_1._2_1_ = '-';
    DAT_001ccdd0_1._3_1_ = '-';
    DAT_001ccdd0_1._4_1_ = '-';
    DAT_001ccdd0_1._5_1_ = '-';
    DAT_001ccdd0_1._6_1_ = '-';
    uRam00000000001ccdd8._0_1_ = '-';
    uRam00000000001ccdd8._1_1_ = '-';
    uRam00000000001ccdd8._2_1_ = '-';
    uRam00000000001ccdd8._3_1_ = '-';
    uRam00000000001ccdd8._4_1_ = '-';
    uRam00000000001ccdd8._5_1_ = '-';
    uRam00000000001ccdd8._6_1_ = '-';
    uRam00000000001ccdd8._7_1_ = '-';
    DAT_001ccdc0 = '-';
    DAT_001ccdc0_1._0_1_ = '-';
    DAT_001ccdc0_1._1_1_ = '-';
    DAT_001ccdc0_1._2_1_ = '-';
    DAT_001ccdc0_1._3_1_ = '-';
    DAT_001ccdc0_1._4_1_ = '-';
    DAT_001ccdc0_1._5_1_ = '-';
    DAT_001ccdc0_1._6_1_ = '-';
    uRam00000000001ccdc8._0_1_ = '-';
    uRam00000000001ccdc8._1_1_ = '-';
    uRam00000000001ccdc8._2_1_ = '-';
    uRam00000000001ccdc8._3_1_ = '-';
    uRam00000000001ccdc8._4_1_ = '-';
    uRam00000000001ccdc8._5_1_ = '-';
    uRam00000000001ccdc8._6_1_ = '-';
    uRam00000000001ccdc8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001ccdb8._0_1_ = '-';
    uRam00000000001ccdb8._1_1_ = '-';
    uRam00000000001ccdb8._2_1_ = '-';
    uRam00000000001ccdb8._3_1_ = '-';
    uRam00000000001ccdb8._4_1_ = '-';
    uRam00000000001ccdb8._5_1_ = '-';
    uRam00000000001ccdb8._6_1_ = '-';
    uRam00000000001ccdb8._7_1_ = '-';
    DAT_001ccdff = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}